

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# order.cpp
# Opt level: O2

void __thiscall haVoc::Moveorder::next_phase(Moveorder *this)

{
  Phase PVar1;
  Score *cutoff;
  element_type *this_00;
  Score local_10;
  Score local_c;
  
  PVar1 = this->m_phase;
  if (BadQuiets < PVar1) {
    return;
  }
  if ((0xefU >> (PVar1 & 0x1f) & 1) != 0) goto LAB_00116d8f;
  if ((0x210U >> (PVar1 & 0x1f) & 1) == 0) {
LAB_00116d69:
    this_00 = (this->m_quiets).super___shared_ptr<haVoc::ScoredMoves,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr;
    if (this_00->m_start < this_00->m_end) {
      return;
    }
    cutoff = &local_10;
  }
  else {
    this_00 = (this->m_captures).super___shared_ptr<haVoc::ScoredMoves,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr;
    if (this_00->m_start < this_00->m_end) {
      if (PVar1 != GoodQuiets) {
        return;
      }
      goto LAB_00116d69;
    }
    cutoff = &local_c;
  }
  *cutoff = ninf;
  ScoredMoves::create_chunk(this_00,cutoff);
  PVar1 = this->m_phase;
LAB_00116d8f:
  this->m_phase = PVar1 + MateKiller1;
  return;
}

Assistant:

void Moveorder::next_phase() {
		if ((m_phase == HashMove) ||
				(m_phase == MateKiller1) ||
				(m_phase == MateKiller2) ||
				(m_phase == Killer1) ||
				(m_phase == Killer2) ||
				(m_phase == InitCaptures) ||
				(m_phase == InitQuiets))
			m_phase = Phase(m_phase + 1);
		else if ((m_phase == GoodCaptures || m_phase == BadCaptures) && m_captures->end())
		{
			m_captures->create_chunk(Score::ninf); // mark bad captures
			m_phase = Phase(m_phase + 1);
		}
		else if ((m_phase == GoodQuiets || m_phase == BadQuiets) && m_quiets->end())
		{
			m_quiets->create_chunk(Score::ninf); // mark bad quiet moves
			m_phase = Phase(m_phase + 1);
		}
	}